

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

size_t libdeflate_deflate_compress_bound(libdeflate_compressor *c,size_t in_nbytes)

{
  undefined8 local_20;
  size_t max_blocks;
  size_t in_nbytes_local;
  libdeflate_compressor *c_local;
  
  if ((in_nbytes + 4999) / 5000 == 0) {
    local_20 = 1;
  }
  else {
    local_20 = (in_nbytes + 4999) / 5000;
  }
  return local_20 * 5 + in_nbytes;
}

Assistant:

LIBDEFLATEAPI size_t
libdeflate_deflate_compress_bound(struct libdeflate_compressor *c,
				  size_t in_nbytes)
{
	size_t max_blocks;

	/*
	 * Since the compressor never uses a compressed block when an
	 * uncompressed block is cheaper, the worst case can be no worse than
	 * the case where only uncompressed blocks are used.
	 *
	 * This is true even though up to 7 bits are "wasted" to byte-align the
	 * bitstream when a compressed block is followed by an uncompressed
	 * block.  This is because a compressed block wouldn't have been used if
	 * it wasn't cheaper than an uncompressed block, and uncompressed blocks
	 * always end on a byte boundary.  So the alignment bits will, at worst,
	 * go up to the place where the uncompressed block would have ended.
	 */

	/*
	 * Calculate the maximum number of uncompressed blocks that the
	 * compressor can use for 'in_nbytes' of data.
	 *
	 * The minimum length that is passed to deflate_flush_block() is
	 * MIN_BLOCK_LENGTH bytes, except for the final block if needed.  If
	 * deflate_flush_block() decides to use an uncompressed block, it
	 * actually will (in general) output a series of uncompressed blocks in
	 * order to stay within the UINT16_MAX limit of DEFLATE.  But this can
	 * be disregarded here as long as '2 * MIN_BLOCK_LENGTH <= UINT16_MAX',
	 * as in that case this behavior can't result in more blocks than the
	 * case where deflate_flush_block() is called with min-length inputs.
	 *
	 * So the number of uncompressed blocks needed would be bounded by
	 * DIV_ROUND_UP(in_nbytes, MIN_BLOCK_LENGTH).  However, empty inputs
	 * need 1 (empty) block, which gives the final expression below.
	 */
	STATIC_ASSERT(2 * MIN_BLOCK_LENGTH <= UINT16_MAX);
	max_blocks = MAX(DIV_ROUND_UP(in_nbytes, MIN_BLOCK_LENGTH), 1);

	/*
	 * Each uncompressed block has 5 bytes of overhead, for the BFINAL,
	 * BTYPE, LEN, and NLEN fields.  (For the reason explained earlier, the
	 * alignment bits at the very start of the block can be disregarded;
	 * they would otherwise increase the overhead to 6 bytes per block.)
	 * Therefore, the maximum number of overhead bytes is '5 * max_blocks'.
	 * To get the final bound, add the number of uncompressed bytes.
	 */
	return (5 * max_blocks) + in_nbytes;
}